

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int MRIStepSVtolerances(void *arkode_mem,realtype reltol,N_Vector abstol)

{
  realtype in_RSI;
  N_Vector in_RDI;
  ARKodeMem in_XMM0_Qa;
  ARKodeMem ark_mem;
  int local_4;
  
  if (in_RDI == (N_Vector)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode::MRIStep","MRIStepSVtolerances",
                    "arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    local_4 = arkSVtolerances(in_XMM0_Qa,in_RSI,in_RDI);
  }
  return local_4;
}

Assistant:

int MRIStepSVtolerances(void *arkode_mem, realtype reltol, N_Vector abstol)
{
  /* unpack ark_mem, call arkSVtolerances, and return */
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::MRIStep",
                    "MRIStepSVtolerances", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;
  return(arkSVtolerances(ark_mem, reltol, abstol));
}